

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Asyncify.cpp
# Opt level: O0

Index __thiscall
wasm::anon_unknown_0::AsyncifyLocals::getFakeCallLocal(AsyncifyLocals *this,Type type)

{
  bool bVar1;
  Index IVar2;
  pointer ppVar3;
  Function *func;
  mapped_type *pmVar4;
  _Node_iterator_base<std::pair<const_wasm::Type,_unsigned_int>,_true> local_30;
  _Node_iterator_base<std::pair<const_wasm::Type,_unsigned_int>,_true> local_28;
  iterator iter;
  AsyncifyLocals *this_local;
  Type type_local;
  
  iter.super__Node_iterator_base<std::pair<const_wasm::Type,_unsigned_int>,_true>._M_cur =
       (_Node_iterator_base<std::pair<const_wasm::Type,_unsigned_int>,_true>)
       (_Node_iterator_base<std::pair<const_wasm::Type,_unsigned_int>,_true>)this;
  this_local = (AsyncifyLocals *)type.id;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<wasm::Type,_unsigned_int,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<std::pair<const_wasm::Type,_unsigned_int>_>_>
       ::find(&this->fakeCallLocals,(key_type *)&this_local);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<wasm::Type,_unsigned_int,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<std::pair<const_wasm::Type,_unsigned_int>_>_>
       ::end(&this->fakeCallLocals);
  bVar1 = std::__detail::operator!=(&local_28,&local_30);
  if (bVar1) {
    ppVar3 = std::__detail::_Node_iterator<std::pair<const_wasm::Type,_unsigned_int>,_false,_true>::
             operator->((_Node_iterator<std::pair<const_wasm::Type,_unsigned_int>,_false,_true> *)
                        &local_28);
    type_local.id._4_4_ = ppVar3->second;
  }
  else {
    std::
    unique_ptr<wasm::(anonymous_namespace)::AsyncifyBuilder,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
    ::operator->(&this->builder);
    func = Walker<wasm::(anonymous_namespace)::AsyncifyLocals,_wasm::Visitor<wasm::(anonymous_namespace)::AsyncifyLocals,_void>_>
           ::getFunction(&(this->
                          super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::AsyncifyLocals,_wasm::Visitor<wasm::(anonymous_namespace)::AsyncifyLocals,_void>_>_>
                          ).
                          super_PostWalker<wasm::(anonymous_namespace)::AsyncifyLocals,_wasm::Visitor<wasm::(anonymous_namespace)::AsyncifyLocals,_void>_>
                          .
                          super_Walker<wasm::(anonymous_namespace)::AsyncifyLocals,_wasm::Visitor<wasm::(anonymous_namespace)::AsyncifyLocals,_void>_>
                        );
    IVar2 = Builder::addVar(func,(Type)this_local);
    pmVar4 = std::
             unordered_map<wasm::Type,_unsigned_int,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<std::pair<const_wasm::Type,_unsigned_int>_>_>
             ::operator[](&this->fakeCallLocals,(key_type *)&this_local);
    *pmVar4 = IVar2;
    type_local.id._4_4_ = IVar2;
  }
  return type_local.id._4_4_;
}

Assistant:

Index getFakeCallLocal(Type type) {
    auto iter = fakeCallLocals.find(type);
    if (iter != fakeCallLocals.end()) {
      return iter->second;
    }
    return fakeCallLocals[type] = builder->addVar(getFunction(), type);
  }